

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Scene *pSVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  RTCIntersectArguments *pRVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  bool bVar68;
  ulong uVar69;
  long lVar70;
  long lVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  undefined4 uVar77;
  ulong unaff_R12;
  size_t mask;
  int iVar78;
  ulong uVar79;
  ulong uVar80;
  bool bVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar93;
  undefined1 auVar87 [32];
  float fVar92;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar88 [32];
  float fVar97;
  float fVar103;
  float fVar104;
  undefined1 auVar98 [16];
  float fVar106;
  float fVar107;
  float fVar109;
  undefined1 auVar99 [32];
  float fVar105;
  float fVar108;
  float fVar110;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar111;
  float fVar115;
  float fVar116;
  undefined1 auVar112 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar113 [32];
  float fVar117;
  undefined1 auVar114 [32];
  float fVar121;
  float fVar122;
  float fVar129;
  float fVar131;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar136;
  float fVar138;
  float fVar140;
  undefined1 auVar127 [32];
  float fVar135;
  float fVar137;
  float fVar139;
  undefined1 auVar128 [64];
  float fVar141;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar144 [64];
  float fVar151;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar155 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  float fVar167;
  float fVar168;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar169 [64];
  float fVar182;
  float fVar183;
  undefined1 auVar184 [32];
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar185 [64];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  float fVar202;
  float fVar203;
  undefined1 auVar204 [32];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar205 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_17fc;
  ulong local_17f8;
  ulong *local_17f0;
  ulong local_17e8;
  ulong local_17e0;
  ulong local_17d8;
  ulong local_17d0;
  ulong local_17c8;
  undefined4 local_17c0;
  float local_17bc;
  float local_17b8;
  undefined4 local_17b4;
  undefined4 local_17b0;
  undefined4 local_17ac;
  uint local_17a8;
  uint local_17a4;
  uint local_17a0;
  RTCFilterFunctionNArguments local_1790;
  undefined8 local_1760;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  undefined8 local_1740;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  ulong local_1200;
  ulong local_11f8 [569];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_17f0 = local_11f8;
      local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar2 = (ray->dir).field_0;
      auVar19 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar82._8_4_ = 0x7fffffff;
      auVar82._0_8_ = 0x7fffffff7fffffff;
      auVar82._12_4_ = 0x7fffffff;
      auVar82 = vandps_avx((undefined1  [16])aVar2,auVar82);
      auVar123._8_4_ = 0x219392ef;
      auVar123._0_8_ = 0x219392ef219392ef;
      auVar123._12_4_ = 0x219392ef;
      auVar82 = vcmpps_avx(auVar82,auVar123,1);
      auVar124._8_4_ = 0x3f800000;
      auVar124._0_8_ = &DAT_3f8000003f800000;
      auVar124._12_4_ = 0x3f800000;
      auVar123 = vdivps_avx(auVar124,(undefined1  [16])aVar2);
      auVar125._8_4_ = 0x5d5e0b6b;
      auVar125._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar125._12_4_ = 0x5d5e0b6b;
      auVar82 = vblendvps_avx(auVar123,auVar125,auVar82);
      auVar112._0_4_ = auVar82._0_4_ * 0.99999964;
      auVar112._4_4_ = auVar82._4_4_ * 0.99999964;
      auVar112._8_4_ = auVar82._8_4_ * 0.99999964;
      auVar112._12_4_ = auVar82._12_4_ * 0.99999964;
      uVar77 = *(undefined4 *)&(ray->org).field_0;
      local_15c0._4_4_ = uVar77;
      local_15c0._0_4_ = uVar77;
      local_15c0._8_4_ = uVar77;
      local_15c0._12_4_ = uVar77;
      local_15c0._16_4_ = uVar77;
      local_15c0._20_4_ = uVar77;
      local_15c0._24_4_ = uVar77;
      local_15c0._28_4_ = uVar77;
      auVar155 = ZEXT3264(local_15c0);
      uVar77 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_15e0._4_4_ = uVar77;
      local_15e0._0_4_ = uVar77;
      local_15e0._8_4_ = uVar77;
      local_15e0._12_4_ = uVar77;
      local_15e0._16_4_ = uVar77;
      local_15e0._20_4_ = uVar77;
      local_15e0._24_4_ = uVar77;
      local_15e0._28_4_ = uVar77;
      auVar162 = ZEXT3264(local_15e0);
      uVar77 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1600._4_4_ = uVar77;
      local_1600._0_4_ = uVar77;
      local_1600._8_4_ = uVar77;
      local_1600._12_4_ = uVar77;
      local_1600._16_4_ = uVar77;
      local_1600._20_4_ = uVar77;
      local_1600._24_4_ = uVar77;
      local_1600._28_4_ = uVar77;
      auVar164 = ZEXT3264(local_1600);
      auVar98._0_4_ = auVar82._0_4_ * 1.0000004;
      auVar98._4_4_ = auVar82._4_4_ * 1.0000004;
      auVar98._8_4_ = auVar82._8_4_ * 1.0000004;
      auVar98._12_4_ = auVar82._12_4_ * 1.0000004;
      auVar82 = vshufps_avx(auVar112,auVar112,0);
      local_1620._16_16_ = auVar82;
      local_1620._0_16_ = auVar82;
      auVar166 = ZEXT3264(local_1620);
      auVar82 = vmovshdup_avx(auVar112);
      auVar123 = vshufps_avx(auVar112,auVar112,0x55);
      local_1640._16_16_ = auVar123;
      local_1640._0_16_ = auVar123;
      auVar169 = ZEXT3264(local_1640);
      auVar123 = vshufpd_avx(auVar112,auVar112,1);
      auVar124 = vshufps_avx(auVar112,auVar112,0xaa);
      local_1660._16_16_ = auVar124;
      local_1660._0_16_ = auVar124;
      auVar185 = ZEXT3264(local_1660);
      auVar124 = vshufps_avx(auVar98,auVar98,0);
      local_1680._16_16_ = auVar124;
      local_1680._0_16_ = auVar124;
      auVar199 = ZEXT3264(local_1680);
      auVar124 = vshufps_avx(auVar98,auVar98,0x55);
      local_16a0._16_16_ = auVar124;
      local_16a0._0_16_ = auVar124;
      auVar201 = ZEXT3264(local_16a0);
      auVar124 = vshufps_avx(auVar98,auVar98,0xaa);
      local_17f8 = (ulong)(auVar112._0_4_ < 0.0) << 5;
      uVar79 = (ulong)(auVar82._0_4_ < 0.0) << 5 | 0x40;
      local_16c0._16_16_ = auVar124;
      local_16c0._0_16_ = auVar124;
      auVar128 = ZEXT3264(local_16c0);
      uVar80 = (ulong)(auVar123._0_4_ < 0.0) << 5 | 0x80;
      uVar75 = local_17f8 ^ 0x20;
      uVar76 = uVar79 ^ 0x20;
      local_17c8 = uVar80 ^ 0x20;
      auVar82 = vshufps_avx(auVar19,auVar19,0);
      local_16e0._16_16_ = auVar82;
      local_16e0._0_16_ = auVar82;
      auVar144 = ZEXT3264(local_16e0);
      auVar82 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
      local_1700._16_16_ = auVar82;
      local_1700._0_16_ = auVar82;
      auVar205 = ZEXT3264(local_1700);
      local_1560._16_16_ = mm_lookupmask_ps._240_16_;
      local_1560._0_16_ = mm_lookupmask_ps._0_16_;
      auVar87._8_4_ = 0x3f800000;
      auVar87._0_8_ = &DAT_3f8000003f800000;
      auVar87._12_4_ = 0x3f800000;
      auVar87._16_4_ = 0x3f800000;
      auVar87._20_4_ = 0x3f800000;
      auVar87._24_4_ = 0x3f800000;
      auVar87._28_4_ = 0x3f800000;
      auVar83._8_4_ = 0xbf800000;
      auVar83._0_8_ = 0xbf800000bf800000;
      auVar83._12_4_ = 0xbf800000;
      auVar83._16_4_ = 0xbf800000;
      auVar83._20_4_ = 0xbf800000;
      auVar83._24_4_ = 0xbf800000;
      auVar83._28_4_ = 0xbf800000;
      local_1580 = vblendvps_avx(auVar87,auVar83,local_1560);
      local_17e8 = uVar80;
      local_17e0 = uVar79;
      do {
        if (local_17f0 == &local_1200) {
          return;
        }
        uVar74 = local_17f0[-1];
        local_17f0 = local_17f0 + -1;
        do {
          if ((uVar74 & 8) == 0) {
            auVar83 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + local_17f8),auVar155._0_32_)
            ;
            auVar20._4_4_ = auVar166._4_4_ * auVar83._4_4_;
            auVar20._0_4_ = auVar166._0_4_ * auVar83._0_4_;
            auVar20._8_4_ = auVar166._8_4_ * auVar83._8_4_;
            auVar20._12_4_ = auVar166._12_4_ * auVar83._12_4_;
            auVar20._16_4_ = auVar166._16_4_ * auVar83._16_4_;
            auVar20._20_4_ = auVar166._20_4_ * auVar83._20_4_;
            auVar20._24_4_ = auVar166._24_4_ * auVar83._24_4_;
            auVar20._28_4_ = auVar83._28_4_;
            auVar83 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + uVar79),auVar162._0_32_);
            auVar21._4_4_ = auVar169._4_4_ * auVar83._4_4_;
            auVar21._0_4_ = auVar169._0_4_ * auVar83._0_4_;
            auVar21._8_4_ = auVar169._8_4_ * auVar83._8_4_;
            auVar21._12_4_ = auVar169._12_4_ * auVar83._12_4_;
            auVar21._16_4_ = auVar169._16_4_ * auVar83._16_4_;
            auVar21._20_4_ = auVar169._20_4_ * auVar83._20_4_;
            auVar21._24_4_ = auVar169._24_4_ * auVar83._24_4_;
            auVar21._28_4_ = auVar83._28_4_;
            auVar83 = vmaxps_avx(auVar20,auVar21);
            auVar87 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + uVar80),auVar164._0_32_);
            auVar22._4_4_ = auVar185._4_4_ * auVar87._4_4_;
            auVar22._0_4_ = auVar185._0_4_ * auVar87._0_4_;
            auVar22._8_4_ = auVar185._8_4_ * auVar87._8_4_;
            auVar22._12_4_ = auVar185._12_4_ * auVar87._12_4_;
            auVar22._16_4_ = auVar185._16_4_ * auVar87._16_4_;
            auVar22._20_4_ = auVar185._20_4_ * auVar87._20_4_;
            auVar22._24_4_ = auVar185._24_4_ * auVar87._24_4_;
            auVar22._28_4_ = auVar87._28_4_;
            auVar87 = vmaxps_avx(auVar22,auVar144._0_32_);
            auVar83 = vmaxps_avx(auVar83,auVar87);
            auVar87 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + uVar75),auVar155._0_32_);
            auVar23._4_4_ = auVar199._4_4_ * auVar87._4_4_;
            auVar23._0_4_ = auVar199._0_4_ * auVar87._0_4_;
            auVar23._8_4_ = auVar199._8_4_ * auVar87._8_4_;
            auVar23._12_4_ = auVar199._12_4_ * auVar87._12_4_;
            auVar23._16_4_ = auVar199._16_4_ * auVar87._16_4_;
            auVar23._20_4_ = auVar199._20_4_ * auVar87._20_4_;
            auVar23._24_4_ = auVar199._24_4_ * auVar87._24_4_;
            auVar23._28_4_ = auVar87._28_4_;
            auVar87 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + uVar76),auVar162._0_32_);
            auVar24._4_4_ = auVar201._4_4_ * auVar87._4_4_;
            auVar24._0_4_ = auVar201._0_4_ * auVar87._0_4_;
            auVar24._8_4_ = auVar201._8_4_ * auVar87._8_4_;
            auVar24._12_4_ = auVar201._12_4_ * auVar87._12_4_;
            auVar24._16_4_ = auVar201._16_4_ * auVar87._16_4_;
            auVar24._20_4_ = auVar201._20_4_ * auVar87._20_4_;
            auVar24._24_4_ = auVar201._24_4_ * auVar87._24_4_;
            auVar24._28_4_ = auVar87._28_4_;
            auVar87 = vminps_avx(auVar23,auVar24);
            auVar20 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + local_17c8),auVar164._0_32_)
            ;
            auVar25._4_4_ = auVar128._4_4_ * auVar20._4_4_;
            auVar25._0_4_ = auVar128._0_4_ * auVar20._0_4_;
            auVar25._8_4_ = auVar128._8_4_ * auVar20._8_4_;
            auVar25._12_4_ = auVar128._12_4_ * auVar20._12_4_;
            auVar25._16_4_ = auVar128._16_4_ * auVar20._16_4_;
            auVar25._20_4_ = auVar128._20_4_ * auVar20._20_4_;
            auVar25._24_4_ = auVar128._24_4_ * auVar20._24_4_;
            auVar25._28_4_ = auVar20._28_4_;
            auVar20 = vminps_avx(auVar25,auVar205._0_32_);
            auVar87 = vminps_avx(auVar87,auVar20);
            auVar83 = vcmpps_avx(auVar83,auVar87,2);
            uVar77 = vmovmskps_avx(auVar83);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar77);
          }
          if ((uVar74 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar78 = 4;
            }
            else {
              uVar73 = uVar74 & 0xfffffffffffffff0;
              lVar71 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
                }
              }
              iVar78 = 0;
              uVar74 = *(ulong *)(uVar73 + lVar71 * 8);
              uVar72 = unaff_R12 - 1 & unaff_R12;
              if (uVar72 != 0) {
                *local_17f0 = uVar74;
                lVar71 = 0;
                if (uVar72 != 0) {
                  for (; (uVar72 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
                  }
                }
                uVar69 = uVar72 - 1;
                while( true ) {
                  local_17f0 = local_17f0 + 1;
                  uVar74 = *(ulong *)(uVar73 + lVar71 * 8);
                  uVar69 = uVar69 & uVar72;
                  if (uVar69 == 0) break;
                  *local_17f0 = uVar74;
                  lVar71 = 0;
                  if (uVar69 != 0) {
                    for (; (uVar69 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
                    }
                  }
                  uVar72 = uVar69 - 1;
                }
              }
            }
          }
          else {
            iVar78 = 6;
          }
        } while (iVar78 == 0);
        if (iVar78 == 6) {
          iVar78 = 0;
          local_17d8 = (ulong)((uint)uVar74 & 0xf) - 8;
          bVar81 = local_17d8 != 0;
          if (bVar81) {
            uVar74 = uVar74 & 0xfffffffffffffff0;
            pSVar3 = context->scene;
            local_17d0 = 0;
            do {
              lVar70 = local_17d0 * 0x60;
              ppfVar4 = (pSVar3->vertices).items;
              pfVar5 = ppfVar4[*(uint *)(uVar74 + 0x40 + lVar70)];
              pfVar6 = ppfVar4[*(uint *)(uVar74 + 0x44 + lVar70)];
              pfVar7 = ppfVar4[*(uint *)(uVar74 + 0x48 + lVar70)];
              pfVar8 = ppfVar4[*(uint *)(uVar74 + 0x4c + lVar70)];
              auVar19 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar74 + lVar70)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar74 + 8 + lVar70)));
              auVar82 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar74 + lVar70)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar74 + 8 + lVar70)));
              auVar124 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar74 + 4 + lVar70)),
                                       *(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar74 + 0xc + lVar70)));
              auVar123 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar74 + 4 + lVar70)),
                                       *(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar74 + 0xc + lVar70)));
              auVar112 = vunpcklps_avx(auVar82,auVar123);
              auVar125 = vunpcklps_avx(auVar19,auVar124);
              auVar82 = vunpckhps_avx(auVar19,auVar124);
              auVar124 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar74 + 0x10 + lVar70)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar74 + 0x18 + lVar70)));
              auVar123 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar74 + 0x10 + lVar70)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar74 + 0x18 + lVar70)));
              auVar98 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar74 + 0x14 + lVar70)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar74 + 0x1c + lVar70)));
              auVar19 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar74 + 0x14 + lVar70)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar74 + 0x1c + lVar70)));
              auVar28 = vunpcklps_avx(auVar123,auVar19);
              auVar29 = vunpcklps_avx(auVar124,auVar98);
              auVar123 = vunpckhps_avx(auVar124,auVar98);
              auVar98 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar74 + 0x20 + lVar70)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar74 + 0x28 + lVar70)));
              auVar19 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar74 + 0x20 + lVar70)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar74 + 0x28 + lVar70)));
              auVar30 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar74 + 0x24 + lVar70)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar74 + 0x2c + lVar70)));
              auVar124 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar74 + 0x24 + lVar70)),
                                       *(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar74 + 0x2c + lVar70)));
              auVar31 = vunpcklps_avx(auVar19,auVar124);
              auVar32 = vunpcklps_avx(auVar98,auVar30);
              auVar19 = vunpckhps_avx(auVar98,auVar30);
              auVar30 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar74 + 0x30 + lVar70)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar74 + 0x38 + lVar70)));
              auVar124 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar74 + 0x30 + lVar70)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar74 + 0x38 + lVar70)));
              auVar33 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar74 + 0x34 + lVar70)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar74 + 0x3c + lVar70)));
              auVar98 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar74 + 0x34 + lVar70)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar74 + 0x3c + lVar70)));
              auVar98 = vunpcklps_avx(auVar124,auVar98);
              auVar34 = vunpcklps_avx(auVar30,auVar33);
              lVar71 = uVar74 + 0x40 + lVar70;
              local_13e0 = *(undefined8 *)(lVar71 + 0x10);
              uStack_13d8 = *(undefined8 *)(lVar71 + 0x18);
              auVar124 = vunpckhps_avx(auVar30,auVar33);
              uStack_13d0 = local_13e0;
              uStack_13c8 = uStack_13d8;
              lVar70 = uVar74 + 0x50 + lVar70;
              local_1400 = *(undefined8 *)(lVar70 + 0x10);
              uStack_13f8 = *(undefined8 *)(lVar70 + 0x18);
              uStack_13f0 = local_1400;
              uStack_13e8 = uStack_13f8;
              auVar204._16_16_ = auVar32;
              auVar204._0_16_ = auVar125;
              auVar152._16_16_ = auVar19;
              auVar152._0_16_ = auVar82;
              auVar84._16_16_ = auVar31;
              auVar84._0_16_ = auVar112;
              auVar113._16_16_ = auVar29;
              auVar113._0_16_ = auVar29;
              auVar126._16_16_ = auVar123;
              auVar126._0_16_ = auVar123;
              auVar85._16_16_ = auVar28;
              auVar85._0_16_ = auVar28;
              auVar163._16_16_ = auVar34;
              auVar163._0_16_ = auVar34;
              auVar165._16_16_ = auVar124;
              auVar165._0_16_ = auVar124;
              auVar99._16_16_ = auVar98;
              auVar99._0_16_ = auVar98;
              uVar77 = *(undefined4 *)&(ray->org).field_0;
              auVar184._4_4_ = uVar77;
              auVar184._0_4_ = uVar77;
              auVar184._8_4_ = uVar77;
              auVar184._12_4_ = uVar77;
              auVar184._16_4_ = uVar77;
              auVar184._20_4_ = uVar77;
              auVar184._24_4_ = uVar77;
              auVar184._28_4_ = uVar77;
              uVar77 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar198._4_4_ = uVar77;
              auVar198._0_4_ = uVar77;
              auVar198._8_4_ = uVar77;
              auVar198._12_4_ = uVar77;
              auVar198._16_4_ = uVar77;
              auVar198._20_4_ = uVar77;
              auVar198._24_4_ = uVar77;
              auVar198._28_4_ = uVar77;
              uVar77 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar200._4_4_ = uVar77;
              auVar200._0_4_ = uVar77;
              auVar200._8_4_ = uVar77;
              auVar200._12_4_ = uVar77;
              auVar200._16_4_ = uVar77;
              auVar200._20_4_ = uVar77;
              auVar200._24_4_ = uVar77;
              auVar200._28_4_ = uVar77;
              local_1420 = vsubps_avx(auVar204,auVar184);
              local_1440 = vsubps_avx(auVar152,auVar198);
              local_1460 = vsubps_avx(auVar84,auVar200);
              auVar83 = vsubps_avx(auVar113,auVar184);
              auVar87 = vsubps_avx(auVar126,auVar198);
              auVar20 = vsubps_avx(auVar85,auVar200);
              auVar21 = vsubps_avx(auVar163,auVar184);
              auVar22 = vsubps_avx(auVar165,auVar198);
              auVar23 = vsubps_avx(auVar99,auVar200);
              local_1480 = vsubps_avx(auVar21,local_1420);
              local_14a0 = vsubps_avx(auVar22,local_1440);
              local_14c0 = vsubps_avx(auVar23,local_1460);
              fVar202 = local_1440._0_4_;
              fVar111 = fVar202 + auVar22._0_4_;
              fVar206 = local_1440._4_4_;
              fVar115 = fVar206 + auVar22._4_4_;
              fVar208 = local_1440._8_4_;
              fVar116 = fVar208 + auVar22._8_4_;
              fVar210 = local_1440._12_4_;
              fVar117 = fVar210 + auVar22._12_4_;
              fVar212 = local_1440._16_4_;
              fVar118 = fVar212 + auVar22._16_4_;
              fVar214 = local_1440._20_4_;
              fVar119 = fVar214 + auVar22._20_4_;
              fVar216 = local_1440._24_4_;
              fVar120 = fVar216 + auVar22._24_4_;
              fVar91 = local_1440._28_4_;
              fVar1 = local_1460._0_4_;
              fVar121 = auVar23._0_4_ + fVar1;
              fVar12 = local_1460._4_4_;
              fVar129 = auVar23._4_4_ + fVar12;
              fVar14 = local_1460._8_4_;
              fVar131 = auVar23._8_4_ + fVar14;
              fVar16 = local_1460._12_4_;
              fVar133 = auVar23._12_4_ + fVar16;
              fVar90 = local_1460._16_4_;
              fVar135 = auVar23._16_4_ + fVar90;
              fVar94 = local_1460._20_4_;
              fVar137 = auVar23._20_4_ + fVar94;
              fVar17 = local_1460._24_4_;
              fVar139 = auVar23._24_4_ + fVar17;
              fVar141 = local_14c0._0_4_;
              fVar145 = local_14c0._4_4_;
              auVar26._4_4_ = fVar145 * fVar115;
              auVar26._0_4_ = fVar141 * fVar111;
              fVar146 = local_14c0._8_4_;
              auVar26._8_4_ = fVar146 * fVar116;
              fVar147 = local_14c0._12_4_;
              auVar26._12_4_ = fVar147 * fVar117;
              fVar148 = local_14c0._16_4_;
              auVar26._16_4_ = fVar148 * fVar118;
              fVar149 = local_14c0._20_4_;
              auVar26._20_4_ = fVar149 * fVar119;
              fVar150 = local_14c0._24_4_;
              auVar26._24_4_ = fVar150 * fVar120;
              auVar26._28_4_ = auVar19._12_4_;
              fVar182 = local_14a0._0_4_;
              fVar186 = local_14a0._4_4_;
              auVar27._4_4_ = fVar186 * fVar129;
              auVar27._0_4_ = fVar182 * fVar121;
              fVar188 = local_14a0._8_4_;
              auVar27._8_4_ = fVar188 * fVar131;
              fVar190 = local_14a0._12_4_;
              auVar27._12_4_ = fVar190 * fVar133;
              fVar192 = local_14a0._16_4_;
              auVar27._16_4_ = fVar192 * fVar135;
              fVar194 = local_14a0._20_4_;
              auVar27._20_4_ = fVar194 * fVar137;
              fVar196 = local_14a0._24_4_;
              auVar27._24_4_ = fVar196 * fVar139;
              auVar27._28_4_ = auVar34._12_4_;
              auVar24 = vsubps_avx(auVar27,auVar26);
              fVar11 = local_1420._0_4_;
              fVar151 = auVar21._0_4_ + fVar11;
              fVar13 = local_1420._4_4_;
              fVar156 = auVar21._4_4_ + fVar13;
              fVar15 = local_1420._8_4_;
              fVar157 = auVar21._8_4_ + fVar15;
              fVar89 = local_1420._12_4_;
              fVar158 = auVar21._12_4_ + fVar89;
              fVar92 = local_1420._16_4_;
              fVar159 = auVar21._16_4_ + fVar92;
              fVar96 = local_1420._20_4_;
              fVar160 = auVar21._20_4_ + fVar96;
              fVar18 = local_1420._24_4_;
              fVar161 = auVar21._24_4_ + fVar18;
              fVar97 = local_1480._0_4_;
              fVar103 = local_1480._4_4_;
              auVar35._4_4_ = fVar103 * fVar129;
              auVar35._0_4_ = fVar97 * fVar121;
              fVar104 = local_1480._8_4_;
              auVar35._8_4_ = fVar104 * fVar131;
              fVar105 = local_1480._12_4_;
              auVar35._12_4_ = fVar105 * fVar133;
              fVar106 = local_1480._16_4_;
              auVar35._16_4_ = fVar106 * fVar135;
              fVar107 = local_1480._20_4_;
              auVar35._20_4_ = fVar107 * fVar137;
              fVar109 = local_1480._24_4_;
              auVar35._24_4_ = fVar109 * fVar139;
              auVar35._28_4_ = auVar23._28_4_ + local_1460._28_4_;
              auVar36._4_4_ = fVar145 * fVar156;
              auVar36._0_4_ = fVar141 * fVar151;
              auVar36._8_4_ = fVar146 * fVar157;
              auVar36._12_4_ = fVar147 * fVar158;
              auVar36._16_4_ = fVar148 * fVar159;
              auVar36._20_4_ = fVar149 * fVar160;
              auVar36._24_4_ = fVar150 * fVar161;
              auVar36._28_4_ = auVar124._12_4_;
              auVar25 = vsubps_avx(auVar36,auVar35);
              auVar37._4_4_ = fVar186 * fVar156;
              auVar37._0_4_ = fVar182 * fVar151;
              auVar37._8_4_ = fVar188 * fVar157;
              auVar37._12_4_ = fVar190 * fVar158;
              auVar37._16_4_ = fVar192 * fVar159;
              auVar37._20_4_ = fVar194 * fVar160;
              auVar37._24_4_ = fVar196 * fVar161;
              auVar37._28_4_ = auVar21._28_4_ + local_1420._28_4_;
              auVar38._4_4_ = fVar103 * fVar115;
              auVar38._0_4_ = fVar97 * fVar111;
              auVar38._8_4_ = fVar104 * fVar116;
              auVar38._12_4_ = fVar105 * fVar117;
              auVar38._16_4_ = fVar106 * fVar118;
              auVar38._20_4_ = fVar107 * fVar119;
              auVar38._24_4_ = fVar109 * fVar120;
              auVar38._28_4_ = fVar91 + auVar22._28_4_;
              auVar26 = vsubps_avx(auVar38,auVar37);
              fStack_171c = (ray->dir).field_0.m128[1];
              local_1760._4_4_ = (ray->dir).field_0.m128[2];
              local_1740._4_4_ = (ray->dir).field_0.m128[0];
              local_15a0._0_4_ =
                   local_1740._4_4_ * auVar24._0_4_ +
                   fStack_171c * auVar25._0_4_ + local_1760._4_4_ * auVar26._0_4_;
              local_15a0._4_4_ =
                   local_1740._4_4_ * auVar24._4_4_ +
                   fStack_171c * auVar25._4_4_ + local_1760._4_4_ * auVar26._4_4_;
              local_15a0._8_4_ =
                   local_1740._4_4_ * auVar24._8_4_ +
                   fStack_171c * auVar25._8_4_ + local_1760._4_4_ * auVar26._8_4_;
              local_15a0._12_4_ =
                   local_1740._4_4_ * auVar24._12_4_ +
                   fStack_171c * auVar25._12_4_ + local_1760._4_4_ * auVar26._12_4_;
              local_15a0._16_4_ =
                   local_1740._4_4_ * auVar24._16_4_ +
                   fStack_171c * auVar25._16_4_ + local_1760._4_4_ * auVar26._16_4_;
              local_15a0._20_4_ =
                   local_1740._4_4_ * auVar24._20_4_ +
                   fStack_171c * auVar25._20_4_ + local_1760._4_4_ * auVar26._20_4_;
              local_15a0._24_4_ =
                   local_1740._4_4_ * auVar24._24_4_ +
                   fStack_171c * auVar25._24_4_ + local_1760._4_4_ * auVar26._24_4_;
              local_15a0._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar26._28_4_;
              auVar24 = vsubps_avx(local_1440,auVar87);
              local_14e0 = vsubps_avx(local_1460,auVar20);
              fVar116 = fVar202 + auVar87._0_4_;
              fVar117 = fVar206 + auVar87._4_4_;
              fVar118 = fVar208 + auVar87._8_4_;
              fVar119 = fVar210 + auVar87._12_4_;
              fVar120 = fVar212 + auVar87._16_4_;
              fVar121 = fVar214 + auVar87._20_4_;
              fVar129 = fVar216 + auVar87._24_4_;
              fVar111 = auVar87._28_4_;
              fVar131 = fVar1 + auVar20._0_4_;
              fVar133 = fVar12 + auVar20._4_4_;
              fVar135 = fVar14 + auVar20._8_4_;
              fVar137 = fVar16 + auVar20._12_4_;
              fVar139 = fVar90 + auVar20._16_4_;
              fVar151 = fVar94 + auVar20._20_4_;
              fVar156 = fVar17 + auVar20._24_4_;
              fVar115 = auVar20._28_4_;
              fVar183 = local_14e0._0_4_;
              fVar187 = local_14e0._4_4_;
              auVar39._4_4_ = fVar187 * fVar117;
              auVar39._0_4_ = fVar183 * fVar116;
              fVar189 = local_14e0._8_4_;
              auVar39._8_4_ = fVar189 * fVar118;
              fVar191 = local_14e0._12_4_;
              auVar39._12_4_ = fVar191 * fVar119;
              fVar193 = local_14e0._16_4_;
              auVar39._16_4_ = fVar193 * fVar120;
              fVar195 = local_14e0._20_4_;
              auVar39._20_4_ = fVar195 * fVar121;
              fVar197 = local_14e0._24_4_;
              auVar39._24_4_ = fVar197 * fVar129;
              auVar39._28_4_ = fVar91;
              fVar167 = auVar24._0_4_;
              fVar170 = auVar24._4_4_;
              auVar40._4_4_ = fVar170 * fVar133;
              auVar40._0_4_ = fVar167 * fVar131;
              fVar172 = auVar24._8_4_;
              auVar40._8_4_ = fVar172 * fVar135;
              fVar174 = auVar24._12_4_;
              auVar40._12_4_ = fVar174 * fVar137;
              fVar176 = auVar24._16_4_;
              auVar40._16_4_ = fVar176 * fVar139;
              fVar178 = auVar24._20_4_;
              auVar40._20_4_ = fVar178 * fVar151;
              fVar180 = auVar24._24_4_;
              auVar40._24_4_ = fVar180 * fVar156;
              auVar40._28_4_ = fVar115;
              auVar25 = vsubps_avx(auVar40,auVar39);
              auVar26 = vsubps_avx(local_1420,auVar83);
              fVar203 = auVar26._0_4_;
              fVar207 = auVar26._4_4_;
              auVar41._4_4_ = fVar207 * fVar133;
              auVar41._0_4_ = fVar203 * fVar131;
              fVar209 = auVar26._8_4_;
              auVar41._8_4_ = fVar209 * fVar135;
              fVar211 = auVar26._12_4_;
              auVar41._12_4_ = fVar211 * fVar137;
              fVar213 = auVar26._16_4_;
              auVar41._16_4_ = fVar213 * fVar139;
              fVar215 = auVar26._20_4_;
              auVar41._20_4_ = fVar215 * fVar151;
              fVar217 = auVar26._24_4_;
              auVar41._24_4_ = fVar217 * fVar156;
              auVar41._28_4_ = local_1460._28_4_ + fVar115;
              fVar131 = fVar11 + auVar83._0_4_;
              fVar133 = fVar13 + auVar83._4_4_;
              fVar135 = fVar15 + auVar83._8_4_;
              fVar137 = fVar89 + auVar83._12_4_;
              fVar139 = fVar92 + auVar83._16_4_;
              fVar151 = fVar96 + auVar83._20_4_;
              fVar156 = fVar18 + auVar83._24_4_;
              auVar42._4_4_ = fVar187 * fVar133;
              auVar42._0_4_ = fVar183 * fVar131;
              auVar42._8_4_ = fVar189 * fVar135;
              auVar42._12_4_ = fVar191 * fVar137;
              auVar42._16_4_ = fVar193 * fVar139;
              auVar42._20_4_ = fVar195 * fVar151;
              auVar42._24_4_ = fVar197 * fVar156;
              auVar42._28_4_ = local_14e0._28_4_;
              auVar26 = vsubps_avx(auVar42,auVar41);
              auVar43._4_4_ = fVar170 * fVar133;
              auVar43._0_4_ = fVar167 * fVar131;
              auVar43._8_4_ = fVar172 * fVar135;
              auVar43._12_4_ = fVar174 * fVar137;
              auVar43._16_4_ = fVar176 * fVar139;
              auVar43._20_4_ = fVar178 * fVar151;
              auVar43._24_4_ = fVar180 * fVar156;
              auVar43._28_4_ = local_1420._28_4_ + auVar83._28_4_;
              auVar44._4_4_ = fVar207 * fVar117;
              auVar44._0_4_ = fVar203 * fVar116;
              auVar44._8_4_ = fVar209 * fVar118;
              auVar44._12_4_ = fVar211 * fVar119;
              auVar44._16_4_ = fVar213 * fVar120;
              auVar44._20_4_ = fVar215 * fVar121;
              auVar44._24_4_ = fVar217 * fVar129;
              auVar44._28_4_ = fVar91 + fVar111;
              auVar27 = vsubps_avx(auVar44,auVar43);
              local_1500._0_4_ =
                   local_1740._4_4_ * auVar25._0_4_ +
                   fStack_171c * auVar26._0_4_ + local_1760._4_4_ * auVar27._0_4_;
              local_1500._4_4_ =
                   local_1740._4_4_ * auVar25._4_4_ +
                   fStack_171c * auVar26._4_4_ + local_1760._4_4_ * auVar27._4_4_;
              local_1500._8_4_ =
                   local_1740._4_4_ * auVar25._8_4_ +
                   fStack_171c * auVar26._8_4_ + local_1760._4_4_ * auVar27._8_4_;
              local_1500._12_4_ =
                   local_1740._4_4_ * auVar25._12_4_ +
                   fStack_171c * auVar26._12_4_ + local_1760._4_4_ * auVar27._12_4_;
              local_1500._16_4_ =
                   local_1740._4_4_ * auVar25._16_4_ +
                   fStack_171c * auVar26._16_4_ + local_1760._4_4_ * auVar27._16_4_;
              local_1500._20_4_ =
                   local_1740._4_4_ * auVar25._20_4_ +
                   fStack_171c * auVar26._20_4_ + local_1760._4_4_ * auVar27._20_4_;
              local_1500._24_4_ =
                   local_1740._4_4_ * auVar25._24_4_ +
                   fStack_171c * auVar26._24_4_ + local_1760._4_4_ * auVar27._24_4_;
              local_1500._28_4_ = auVar25._28_4_ + auVar26._28_4_ + auVar27._28_4_;
              auVar25 = vsubps_avx(auVar83,auVar21);
              fVar157 = auVar83._0_4_ + auVar21._0_4_;
              fVar158 = auVar83._4_4_ + auVar21._4_4_;
              fVar159 = auVar83._8_4_ + auVar21._8_4_;
              fVar160 = auVar83._12_4_ + auVar21._12_4_;
              fVar161 = auVar83._16_4_ + auVar21._16_4_;
              fVar91 = auVar83._20_4_ + auVar21._20_4_;
              fVar93 = auVar83._24_4_ + auVar21._24_4_;
              fVar95 = auVar83._28_4_ + auVar21._28_4_;
              auVar83 = vsubps_avx(auVar87,auVar22);
              fVar131 = auVar87._0_4_ + auVar22._0_4_;
              fVar133 = auVar87._4_4_ + auVar22._4_4_;
              fVar135 = auVar87._8_4_ + auVar22._8_4_;
              fVar137 = auVar87._12_4_ + auVar22._12_4_;
              fVar139 = auVar87._16_4_ + auVar22._16_4_;
              fVar151 = auVar87._20_4_ + auVar22._20_4_;
              fVar156 = auVar87._24_4_ + auVar22._24_4_;
              auVar21 = vsubps_avx(auVar20,auVar23);
              fVar118 = auVar23._0_4_ + auVar20._0_4_;
              fVar119 = auVar23._4_4_ + auVar20._4_4_;
              fVar120 = auVar23._8_4_ + auVar20._8_4_;
              fVar121 = auVar23._12_4_ + auVar20._12_4_;
              fVar129 = auVar23._16_4_ + auVar20._16_4_;
              fVar108 = auVar23._20_4_ + auVar20._20_4_;
              fVar110 = auVar23._24_4_ + auVar20._24_4_;
              fVar122 = auVar21._0_4_;
              fVar130 = auVar21._4_4_;
              auVar45._4_4_ = fVar130 * fVar133;
              auVar45._0_4_ = fVar122 * fVar131;
              fVar132 = auVar21._8_4_;
              auVar45._8_4_ = fVar132 * fVar135;
              fVar134 = auVar21._12_4_;
              auVar45._12_4_ = fVar134 * fVar137;
              fVar136 = auVar21._16_4_;
              auVar45._16_4_ = fVar136 * fVar139;
              fVar138 = auVar21._20_4_;
              auVar45._20_4_ = fVar138 * fVar151;
              fVar140 = auVar21._24_4_;
              auVar45._24_4_ = fVar140 * fVar156;
              auVar45._28_4_ = auVar25._28_4_;
              fVar168 = auVar83._0_4_;
              fVar171 = auVar83._4_4_;
              auVar46._4_4_ = fVar171 * fVar119;
              auVar46._0_4_ = fVar168 * fVar118;
              fVar173 = auVar83._8_4_;
              auVar46._8_4_ = fVar173 * fVar120;
              fVar175 = auVar83._12_4_;
              auVar46._12_4_ = fVar175 * fVar121;
              fVar177 = auVar83._16_4_;
              auVar46._16_4_ = fVar177 * fVar129;
              fVar179 = auVar83._20_4_;
              auVar46._20_4_ = fVar179 * fVar108;
              fVar181 = auVar83._24_4_;
              auVar46._24_4_ = fVar181 * fVar110;
              auVar46._28_4_ = fVar111;
              auVar83 = vsubps_avx(auVar46,auVar45);
              fVar116 = auVar25._0_4_;
              fVar117 = auVar25._4_4_;
              auVar47._4_4_ = fVar117 * fVar119;
              auVar47._0_4_ = fVar116 * fVar118;
              fVar118 = auVar25._8_4_;
              auVar47._8_4_ = fVar118 * fVar120;
              fVar119 = auVar25._12_4_;
              auVar47._12_4_ = fVar119 * fVar121;
              fVar120 = auVar25._16_4_;
              auVar47._16_4_ = fVar120 * fVar129;
              fVar121 = auVar25._20_4_;
              auVar47._20_4_ = fVar121 * fVar108;
              fVar129 = auVar25._24_4_;
              auVar47._24_4_ = fVar129 * fVar110;
              auVar47._28_4_ = auVar23._28_4_ + fVar115;
              auVar48._4_4_ = fVar130 * fVar158;
              auVar48._0_4_ = fVar122 * fVar157;
              auVar48._8_4_ = fVar132 * fVar159;
              auVar48._12_4_ = fVar134 * fVar160;
              auVar48._16_4_ = fVar136 * fVar161;
              auVar48._20_4_ = fVar138 * fVar91;
              auVar48._24_4_ = fVar140 * fVar93;
              auVar48._28_4_ = fVar111;
              auVar87 = vsubps_avx(auVar48,auVar47);
              auVar49._4_4_ = fVar171 * fVar158;
              auVar49._0_4_ = fVar168 * fVar157;
              auVar49._8_4_ = fVar173 * fVar159;
              auVar49._12_4_ = fVar175 * fVar160;
              auVar49._16_4_ = fVar177 * fVar161;
              auVar49._20_4_ = fVar179 * fVar91;
              auVar49._24_4_ = fVar181 * fVar93;
              auVar49._28_4_ = fVar95;
              auVar50._4_4_ = fVar117 * fVar133;
              auVar50._0_4_ = fVar116 * fVar131;
              auVar50._8_4_ = fVar118 * fVar135;
              auVar50._12_4_ = fVar119 * fVar137;
              auVar50._16_4_ = fVar120 * fVar139;
              auVar50._20_4_ = fVar121 * fVar151;
              auVar50._24_4_ = fVar129 * fVar156;
              auVar50._28_4_ = fVar111 + auVar22._28_4_;
              auVar20 = vsubps_avx(auVar50,auVar49);
              local_1760._0_4_ = local_1760._4_4_;
              fStack_1758 = local_1760._4_4_;
              fStack_1754 = local_1760._4_4_;
              fStack_1750 = local_1760._4_4_;
              fStack_174c = local_1760._4_4_;
              fStack_1748 = local_1760._4_4_;
              fStack_1744 = local_1760._4_4_;
              local_1720 = fStack_171c;
              fStack_1718 = fStack_171c;
              fStack_1714 = fStack_171c;
              fStack_1710 = fStack_171c;
              fStack_170c = fStack_171c;
              fStack_1708 = fStack_171c;
              fStack_1704 = fStack_171c;
              local_1740._0_4_ = local_1740._4_4_;
              fStack_1738 = local_1740._4_4_;
              fStack_1734 = local_1740._4_4_;
              fStack_1730 = local_1740._4_4_;
              fStack_172c = local_1740._4_4_;
              fStack_1728 = local_1740._4_4_;
              fStack_1724 = local_1740._4_4_;
              auVar86._0_4_ =
                   local_1740._4_4_ * auVar83._0_4_ +
                   fStack_171c * auVar87._0_4_ + local_1760._4_4_ * auVar20._0_4_;
              auVar86._4_4_ =
                   local_1740._4_4_ * auVar83._4_4_ +
                   fStack_171c * auVar87._4_4_ + local_1760._4_4_ * auVar20._4_4_;
              auVar86._8_4_ =
                   local_1740._4_4_ * auVar83._8_4_ +
                   fStack_171c * auVar87._8_4_ + local_1760._4_4_ * auVar20._8_4_;
              auVar86._12_4_ =
                   local_1740._4_4_ * auVar83._12_4_ +
                   fStack_171c * auVar87._12_4_ + local_1760._4_4_ * auVar20._12_4_;
              auVar86._16_4_ =
                   local_1740._4_4_ * auVar83._16_4_ +
                   fStack_171c * auVar87._16_4_ + local_1760._4_4_ * auVar20._16_4_;
              auVar86._20_4_ =
                   local_1740._4_4_ * auVar83._20_4_ +
                   fStack_171c * auVar87._20_4_ + local_1760._4_4_ * auVar20._20_4_;
              auVar86._24_4_ =
                   local_1740._4_4_ * auVar83._24_4_ +
                   fStack_171c * auVar87._24_4_ + local_1760._4_4_ * auVar20._24_4_;
              auVar86._28_4_ = fVar95 + fVar95 + auVar20._28_4_;
              local_1540._0_4_ = auVar86._0_4_ + local_15a0._0_4_ + local_1500._0_4_;
              local_1540._4_4_ = auVar86._4_4_ + local_15a0._4_4_ + local_1500._4_4_;
              local_1540._8_4_ = auVar86._8_4_ + local_15a0._8_4_ + local_1500._8_4_;
              local_1540._12_4_ = auVar86._12_4_ + local_15a0._12_4_ + local_1500._12_4_;
              local_1540._16_4_ = auVar86._16_4_ + local_15a0._16_4_ + local_1500._16_4_;
              local_1540._20_4_ = auVar86._20_4_ + local_15a0._20_4_ + local_1500._20_4_;
              local_1540._24_4_ = auVar86._24_4_ + local_15a0._24_4_ + local_1500._24_4_;
              local_1540._28_4_ = auVar86._28_4_ + local_15a0._28_4_ + local_1500._28_4_;
              auVar83 = vminps_avx(local_15a0,local_1500);
              auVar83 = vminps_avx(auVar83,auVar86);
              auVar100._8_4_ = 0x7fffffff;
              auVar100._0_8_ = 0x7fffffff7fffffff;
              auVar100._12_4_ = 0x7fffffff;
              auVar100._16_4_ = 0x7fffffff;
              auVar100._20_4_ = 0x7fffffff;
              auVar100._24_4_ = 0x7fffffff;
              auVar100._28_4_ = 0x7fffffff;
              local_1520 = vandps_avx(local_1540,auVar100);
              fVar111 = local_1520._0_4_ * 1.1920929e-07;
              fVar115 = local_1520._4_4_ * 1.1920929e-07;
              auVar51._4_4_ = fVar115;
              auVar51._0_4_ = fVar111;
              fVar131 = local_1520._8_4_ * 1.1920929e-07;
              auVar51._8_4_ = fVar131;
              fVar133 = local_1520._12_4_ * 1.1920929e-07;
              auVar51._12_4_ = fVar133;
              fVar135 = local_1520._16_4_ * 1.1920929e-07;
              auVar51._16_4_ = fVar135;
              fVar137 = local_1520._20_4_ * 1.1920929e-07;
              auVar51._20_4_ = fVar137;
              fVar139 = local_1520._24_4_ * 1.1920929e-07;
              auVar51._24_4_ = fVar139;
              auVar51._28_4_ = 0x34000000;
              auVar153._0_8_ = CONCAT44(fVar115,fVar111) ^ 0x8000000080000000;
              auVar153._8_4_ = -fVar131;
              auVar153._12_4_ = -fVar133;
              auVar153._16_4_ = -fVar135;
              auVar153._20_4_ = -fVar137;
              auVar153._24_4_ = -fVar139;
              auVar153._28_4_ = 0xb4000000;
              auVar83 = vcmpps_avx(auVar83,auVar153,5);
              auVar20 = vmaxps_avx(local_15a0,local_1500);
              auVar87 = vmaxps_avx(auVar20,auVar86);
              auVar87 = vcmpps_avx(auVar87,auVar51,2);
              auVar87 = vorps_avx(auVar83,auVar87);
              if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar87 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar87 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar87 >> 0x7f,0) == '\0') &&
                    (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar87 >> 0xbf,0) == '\0') &&
                  (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar87[0x1f]) {
LAB_0030d233:
                auVar155 = ZEXT3264(local_15c0);
                auVar162 = ZEXT3264(local_15e0);
                auVar164 = ZEXT3264(local_1600);
                auVar166 = ZEXT3264(local_1620);
                auVar169 = ZEXT3264(local_1640);
                auVar185 = ZEXT3264(local_1660);
                auVar199 = ZEXT3264(local_1680);
                auVar201 = ZEXT3264(local_16a0);
                auVar128 = ZEXT3264(local_16c0);
                auVar144 = ZEXT3264(local_16e0);
                auVar205 = ZEXT3264(local_1700);
              }
              else {
                auVar52._4_4_ = fVar170 * fVar145;
                auVar52._0_4_ = fVar167 * fVar141;
                auVar52._8_4_ = fVar172 * fVar146;
                auVar52._12_4_ = fVar174 * fVar147;
                auVar52._16_4_ = fVar176 * fVar148;
                auVar52._20_4_ = fVar178 * fVar149;
                auVar52._24_4_ = fVar180 * fVar150;
                auVar52._28_4_ = auVar83._28_4_;
                auVar53._4_4_ = fVar186 * fVar187;
                auVar53._0_4_ = fVar182 * fVar183;
                auVar53._8_4_ = fVar188 * fVar189;
                auVar53._12_4_ = fVar190 * fVar191;
                auVar53._16_4_ = fVar192 * fVar193;
                auVar53._20_4_ = fVar194 * fVar195;
                auVar53._24_4_ = fVar196 * fVar197;
                auVar53._28_4_ = 0x34000000;
                auVar22 = vsubps_avx(auVar53,auVar52);
                auVar54._4_4_ = fVar187 * fVar171;
                auVar54._0_4_ = fVar183 * fVar168;
                auVar54._8_4_ = fVar189 * fVar173;
                auVar54._12_4_ = fVar191 * fVar175;
                auVar54._16_4_ = fVar193 * fVar177;
                auVar54._20_4_ = fVar195 * fVar179;
                auVar54._24_4_ = fVar197 * fVar181;
                auVar54._28_4_ = auVar20._28_4_;
                auVar55._4_4_ = fVar170 * fVar130;
                auVar55._0_4_ = fVar167 * fVar122;
                auVar55._8_4_ = fVar172 * fVar132;
                auVar55._12_4_ = fVar174 * fVar134;
                auVar55._16_4_ = fVar176 * fVar136;
                auVar55._20_4_ = fVar178 * fVar138;
                auVar55._24_4_ = fVar180 * fVar140;
                auVar55._28_4_ = auVar24._28_4_;
                auVar23 = vsubps_avx(auVar55,auVar54);
                auVar114._8_4_ = 0x7fffffff;
                auVar114._0_8_ = 0x7fffffff7fffffff;
                auVar114._12_4_ = 0x7fffffff;
                auVar114._16_4_ = 0x7fffffff;
                auVar114._20_4_ = 0x7fffffff;
                auVar114._24_4_ = 0x7fffffff;
                auVar114._28_4_ = 0x7fffffff;
                auVar83 = vandps_avx(auVar52,auVar114);
                auVar20 = vandps_avx(auVar54,auVar114);
                auVar83 = vcmpps_avx(auVar83,auVar20,1);
                local_1360 = vblendvps_avx(auVar23,auVar22,auVar83);
                auVar56._4_4_ = fVar207 * fVar130;
                auVar56._0_4_ = fVar203 * fVar122;
                auVar56._8_4_ = fVar209 * fVar132;
                auVar56._12_4_ = fVar211 * fVar134;
                auVar56._16_4_ = fVar213 * fVar136;
                auVar56._20_4_ = fVar215 * fVar138;
                auVar56._24_4_ = fVar217 * fVar140;
                auVar56._28_4_ = auVar83._28_4_;
                auVar57._4_4_ = fVar207 * fVar145;
                auVar57._0_4_ = fVar203 * fVar141;
                auVar57._8_4_ = fVar209 * fVar146;
                auVar57._12_4_ = fVar211 * fVar147;
                auVar57._16_4_ = fVar213 * fVar148;
                auVar57._20_4_ = fVar215 * fVar149;
                auVar57._24_4_ = fVar217 * fVar150;
                auVar57._28_4_ = auVar22._28_4_;
                auVar58._4_4_ = fVar103 * fVar187;
                auVar58._0_4_ = fVar97 * fVar183;
                auVar58._8_4_ = fVar104 * fVar189;
                auVar58._12_4_ = fVar105 * fVar191;
                auVar58._16_4_ = fVar106 * fVar193;
                auVar58._20_4_ = fVar107 * fVar195;
                auVar58._24_4_ = fVar109 * fVar197;
                auVar58._28_4_ = local_14c0._28_4_;
                auVar22 = vsubps_avx(auVar57,auVar58);
                auVar59._4_4_ = fVar187 * fVar117;
                auVar59._0_4_ = fVar183 * fVar116;
                auVar59._8_4_ = fVar189 * fVar118;
                auVar59._12_4_ = fVar191 * fVar119;
                auVar59._16_4_ = fVar193 * fVar120;
                auVar59._20_4_ = fVar195 * fVar121;
                auVar59._24_4_ = fVar197 * fVar129;
                auVar59._28_4_ = auVar20._28_4_;
                auVar23 = vsubps_avx(auVar59,auVar56);
                auVar83 = vandps_avx(auVar58,auVar114);
                auVar20 = vandps_avx(auVar56,auVar114);
                auVar83 = vcmpps_avx(auVar83,auVar20,1);
                local_1340 = vblendvps_avx(auVar23,auVar22,auVar83);
                auVar60._4_4_ = fVar170 * fVar117;
                auVar60._0_4_ = fVar167 * fVar116;
                auVar60._8_4_ = fVar172 * fVar118;
                auVar60._12_4_ = fVar174 * fVar119;
                auVar60._16_4_ = fVar176 * fVar120;
                auVar60._20_4_ = fVar178 * fVar121;
                auVar60._24_4_ = fVar180 * fVar129;
                auVar60._28_4_ = auVar83._28_4_;
                auVar61._4_4_ = fVar103 * fVar170;
                auVar61._0_4_ = fVar97 * fVar167;
                auVar61._8_4_ = fVar104 * fVar172;
                auVar61._12_4_ = fVar105 * fVar174;
                auVar61._16_4_ = fVar106 * fVar176;
                auVar61._20_4_ = fVar107 * fVar178;
                auVar61._24_4_ = fVar109 * fVar180;
                auVar61._28_4_ = auVar22._28_4_;
                auVar62._4_4_ = fVar186 * fVar207;
                auVar62._0_4_ = fVar182 * fVar203;
                auVar62._8_4_ = fVar188 * fVar209;
                auVar62._12_4_ = fVar190 * fVar211;
                auVar62._16_4_ = fVar192 * fVar213;
                auVar62._20_4_ = fVar194 * fVar215;
                auVar62._24_4_ = fVar196 * fVar217;
                auVar62._28_4_ = auVar21._28_4_;
                auVar63._4_4_ = fVar207 * fVar171;
                auVar63._0_4_ = fVar203 * fVar168;
                auVar63._8_4_ = fVar209 * fVar173;
                auVar63._12_4_ = fVar211 * fVar175;
                auVar63._16_4_ = fVar213 * fVar177;
                auVar63._20_4_ = fVar215 * fVar179;
                auVar63._24_4_ = fVar217 * fVar181;
                auVar63._28_4_ = auVar25._28_4_;
                auVar21 = vsubps_avx(auVar61,auVar62);
                auVar22 = vsubps_avx(auVar63,auVar60);
                auVar83 = vandps_avx(auVar62,auVar114);
                auVar20 = vandps_avx(auVar60,auVar114);
                auVar20 = vcmpps_avx(auVar83,auVar20,1);
                local_1320 = vblendvps_avx(auVar22,auVar21,auVar20);
                auVar82 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
                fVar115 = local_1320._0_4_;
                fVar116 = local_1320._4_4_;
                fVar117 = local_1320._8_4_;
                fVar118 = local_1320._12_4_;
                fVar119 = local_1320._16_4_;
                fVar120 = local_1320._20_4_;
                fVar121 = local_1320._24_4_;
                fVar156 = local_1340._0_4_;
                fVar157 = local_1340._4_4_;
                fVar158 = local_1340._8_4_;
                fVar159 = local_1340._12_4_;
                fVar160 = local_1340._16_4_;
                fVar161 = local_1340._20_4_;
                fVar91 = local_1340._24_4_;
                fVar93 = local_1360._0_4_;
                fVar95 = local_1360._4_4_;
                fVar97 = local_1360._8_4_;
                fVar103 = local_1360._12_4_;
                fVar104 = local_1360._16_4_;
                fVar105 = local_1360._20_4_;
                fVar106 = local_1360._24_4_;
                fVar111 = fVar93 * local_1740._4_4_ +
                          fVar156 * fStack_171c + fVar115 * local_1760._4_4_;
                fVar129 = fVar95 * local_1740._4_4_ +
                          fVar157 * fStack_171c + fVar116 * local_1760._4_4_;
                fVar131 = fVar97 * local_1740._4_4_ +
                          fVar158 * fStack_171c + fVar117 * local_1760._4_4_;
                fVar133 = fVar103 * local_1740._4_4_ +
                          fVar159 * fStack_171c + fVar118 * local_1760._4_4_;
                fVar135 = fVar104 * local_1740._4_4_ +
                          fVar160 * fStack_171c + fVar119 * local_1760._4_4_;
                fVar137 = fVar105 * local_1740._4_4_ +
                          fVar161 * fStack_171c + fVar120 * local_1760._4_4_;
                fVar139 = fVar106 * local_1740._4_4_ +
                          fVar91 * fStack_171c + fVar121 * local_1760._4_4_;
                fVar151 = auVar21._28_4_ + auVar21._28_4_ + 0.0;
                auVar101._0_4_ = fVar111 + fVar111;
                auVar101._4_4_ = fVar129 + fVar129;
                auVar101._8_4_ = fVar131 + fVar131;
                auVar101._12_4_ = fVar133 + fVar133;
                auVar101._16_4_ = fVar135 + fVar135;
                auVar101._20_4_ = fVar137 + fVar137;
                auVar101._24_4_ = fVar139 + fVar139;
                auVar101._28_4_ = fVar151 + fVar151;
                fVar111 = auVar83._28_4_;
                auVar83 = vrcpps_avx(auVar101);
                fVar129 = fVar93 * fVar11 + fVar156 * fVar202 + fVar115 * fVar1;
                fVar131 = fVar95 * fVar13 + fVar157 * fVar206 + fVar116 * fVar12;
                fVar133 = fVar97 * fVar15 + fVar158 * fVar208 + fVar117 * fVar14;
                fVar89 = fVar103 * fVar89 + fVar159 * fVar210 + fVar118 * fVar16;
                fVar90 = fVar104 * fVar92 + fVar160 * fVar212 + fVar119 * fVar90;
                fVar92 = fVar105 * fVar96 + fVar161 * fVar214 + fVar120 * fVar94;
                fVar94 = fVar106 * fVar18 + fVar91 * fVar216 + fVar121 * fVar17;
                fVar96 = fVar111 + fVar111 + fVar151;
                fVar1 = auVar83._0_4_;
                fVar11 = auVar83._4_4_;
                auVar64._4_4_ = auVar101._4_4_ * fVar11;
                auVar64._0_4_ = auVar101._0_4_ * fVar1;
                fVar12 = auVar83._8_4_;
                auVar64._8_4_ = auVar101._8_4_ * fVar12;
                fVar13 = auVar83._12_4_;
                auVar64._12_4_ = auVar101._12_4_ * fVar13;
                fVar14 = auVar83._16_4_;
                auVar64._16_4_ = auVar101._16_4_ * fVar14;
                fVar15 = auVar83._20_4_;
                auVar64._20_4_ = auVar101._20_4_ * fVar15;
                fVar16 = auVar83._24_4_;
                auVar64._24_4_ = auVar101._24_4_ * fVar16;
                auVar64._28_4_ = fVar111;
                auVar154._8_4_ = 0x3f800000;
                auVar154._0_8_ = &DAT_3f8000003f800000;
                auVar154._12_4_ = 0x3f800000;
                auVar154._16_4_ = 0x3f800000;
                auVar154._20_4_ = 0x3f800000;
                auVar154._24_4_ = 0x3f800000;
                auVar154._28_4_ = 0x3f800000;
                auVar83 = vsubps_avx(auVar154,auVar64);
                uVar77 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar142._4_4_ = uVar77;
                auVar142._0_4_ = uVar77;
                auVar142._8_4_ = uVar77;
                auVar142._12_4_ = uVar77;
                auVar142._16_4_ = uVar77;
                auVar142._20_4_ = uVar77;
                auVar142._24_4_ = uVar77;
                auVar142._28_4_ = uVar77;
                local_12a0._4_4_ = (fVar131 + fVar131) * (fVar11 + fVar11 * auVar83._4_4_);
                local_12a0._0_4_ = (fVar129 + fVar129) * (fVar1 + fVar1 * auVar83._0_4_);
                local_12a0._8_4_ = (fVar133 + fVar133) * (fVar12 + fVar12 * auVar83._8_4_);
                local_12a0._12_4_ = (fVar89 + fVar89) * (fVar13 + fVar13 * auVar83._12_4_);
                local_12a0._16_4_ = (fVar90 + fVar90) * (fVar14 + fVar14 * auVar83._16_4_);
                local_12a0._20_4_ = (fVar92 + fVar92) * (fVar15 + fVar15 * auVar83._20_4_);
                local_12a0._24_4_ = (fVar94 + fVar94) * (fVar16 + fVar16 * auVar83._24_4_);
                local_12a0._28_4_ = fVar96 + fVar96;
                auVar83 = vcmpps_avx(auVar142,local_12a0,2);
                fVar1 = ray->tfar;
                auVar143._4_4_ = fVar1;
                auVar143._0_4_ = fVar1;
                auVar143._8_4_ = fVar1;
                auVar143._12_4_ = fVar1;
                auVar143._16_4_ = fVar1;
                auVar143._20_4_ = fVar1;
                auVar143._24_4_ = fVar1;
                auVar143._28_4_ = fVar1;
                auVar87 = vcmpps_avx(local_12a0,auVar143,2);
                auVar83 = vandps_avx(auVar87,auVar83);
                auVar87 = vcmpps_avx(auVar101,_DAT_02020f00,4);
                auVar83 = vandps_avx(auVar83,auVar87);
                auVar123 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
                auVar82 = vpand_avx(auVar123,auVar82);
                auVar123 = vpmovsxwd_avx(auVar82);
                auVar19 = vpshufd_avx(auVar82,0xee);
                auVar19 = vpmovsxwd_avx(auVar19);
                local_1300._16_16_ = auVar19;
                local_1300._0_16_ = auVar123;
                if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_1300 >> 0x7f,0) == '\0') &&
                      (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar19 >> 0x3f,0) == '\0') &&
                    (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar19[0xf]) goto LAB_0030d233;
                local_13c0 = local_15a0._0_4_;
                fStack_13bc = local_15a0._4_4_;
                fStack_13b8 = local_15a0._8_4_;
                fStack_13b4 = local_15a0._12_4_;
                fStack_13b0 = local_15a0._16_4_;
                fStack_13ac = local_15a0._20_4_;
                fStack_13a8 = local_15a0._24_4_;
                fStack_13a4 = local_15a0._28_4_;
                local_13a0 = local_1500._0_4_;
                fStack_139c = local_1500._4_4_;
                fStack_1398 = local_1500._8_4_;
                fStack_1394 = local_1500._12_4_;
                fStack_1390 = local_1500._16_4_;
                fStack_138c = local_1500._20_4_;
                fStack_1388 = local_1500._24_4_;
                fStack_1384 = local_1500._28_4_;
                local_1380 = local_1540;
                local_1220 = local_1560;
                auVar83 = vrcpps_avx(local_1540);
                fVar1 = auVar83._0_4_;
                fVar11 = auVar83._4_4_;
                auVar65._4_4_ = local_1540._4_4_ * fVar11;
                auVar65._0_4_ = local_1540._0_4_ * fVar1;
                fVar12 = auVar83._8_4_;
                auVar65._8_4_ = local_1540._8_4_ * fVar12;
                fVar13 = auVar83._12_4_;
                auVar65._12_4_ = local_1540._12_4_ * fVar13;
                fVar14 = auVar83._16_4_;
                auVar65._16_4_ = local_1540._16_4_ * fVar14;
                fVar15 = auVar83._20_4_;
                auVar65._20_4_ = local_1540._20_4_ * fVar15;
                fVar16 = auVar83._24_4_;
                auVar65._24_4_ = local_1540._24_4_ * fVar16;
                auVar65._28_4_ = auVar19._12_4_;
                auVar127._8_4_ = 0x3f800000;
                auVar127._0_8_ = &DAT_3f8000003f800000;
                auVar127._12_4_ = 0x3f800000;
                auVar127._16_4_ = 0x3f800000;
                auVar127._20_4_ = 0x3f800000;
                auVar127._24_4_ = 0x3f800000;
                auVar127._28_4_ = 0x3f800000;
                auVar87 = vsubps_avx(auVar127,auVar65);
                auVar88._0_4_ = fVar1 + fVar1 * auVar87._0_4_;
                auVar88._4_4_ = fVar11 + fVar11 * auVar87._4_4_;
                auVar88._8_4_ = fVar12 + fVar12 * auVar87._8_4_;
                auVar88._12_4_ = fVar13 + fVar13 * auVar87._12_4_;
                auVar88._16_4_ = fVar14 + fVar14 * auVar87._16_4_;
                auVar88._20_4_ = fVar15 + fVar15 * auVar87._20_4_;
                auVar88._24_4_ = fVar16 + fVar16 * auVar87._24_4_;
                auVar88._28_4_ = auVar83._28_4_ + auVar87._28_4_;
                auVar102._8_4_ = 0x219392ef;
                auVar102._0_8_ = 0x219392ef219392ef;
                auVar102._12_4_ = 0x219392ef;
                auVar102._16_4_ = 0x219392ef;
                auVar102._20_4_ = 0x219392ef;
                auVar102._24_4_ = 0x219392ef;
                auVar102._28_4_ = 0x219392ef;
                auVar87 = vcmpps_avx(local_1520,auVar102,5);
                auVar83 = vandps_avx(auVar87,auVar88);
                auVar66._4_4_ = local_15a0._4_4_ * auVar83._4_4_;
                auVar66._0_4_ = local_15a0._0_4_ * auVar83._0_4_;
                auVar66._8_4_ = local_15a0._8_4_ * auVar83._8_4_;
                auVar66._12_4_ = local_15a0._12_4_ * auVar83._12_4_;
                auVar66._16_4_ = local_15a0._16_4_ * auVar83._16_4_;
                auVar66._20_4_ = local_15a0._20_4_ * auVar83._20_4_;
                auVar66._24_4_ = local_15a0._24_4_ * auVar83._24_4_;
                auVar66._28_4_ = auVar87._28_4_;
                auVar87 = vminps_avx(auVar66,auVar127);
                auVar67._4_4_ = local_1500._4_4_ * auVar83._4_4_;
                auVar67._0_4_ = local_1500._0_4_ * auVar83._0_4_;
                auVar67._8_4_ = local_1500._8_4_ * auVar83._8_4_;
                auVar67._12_4_ = local_1500._12_4_ * auVar83._12_4_;
                auVar67._16_4_ = local_1500._16_4_ * auVar83._16_4_;
                auVar67._20_4_ = local_1500._20_4_ * auVar83._20_4_;
                auVar67._24_4_ = local_1500._24_4_ * auVar83._24_4_;
                auVar67._28_4_ = auVar83._28_4_;
                auVar83 = vminps_avx(auVar67,auVar127);
                auVar20 = vsubps_avx(auVar127,auVar87);
                auVar21 = vsubps_avx(auVar127,auVar83);
                local_12c0 = vblendvps_avx(auVar83,auVar20,local_1560);
                local_12e0 = vblendvps_avx(auVar87,auVar21,local_1560);
                fVar1 = local_1580._0_4_;
                fVar11 = local_1580._4_4_;
                local_1280._4_4_ = fVar95 * fVar11;
                local_1280._0_4_ = fVar93 * fVar1;
                fVar12 = local_1580._8_4_;
                local_1280._8_4_ = fVar97 * fVar12;
                fVar13 = local_1580._12_4_;
                local_1280._12_4_ = fVar103 * fVar13;
                fVar14 = local_1580._16_4_;
                local_1280._16_4_ = fVar104 * fVar14;
                fVar15 = local_1580._20_4_;
                local_1280._20_4_ = fVar105 * fVar15;
                fVar16 = local_1580._24_4_;
                local_1280._24_4_ = fVar106 * fVar16;
                local_1280._28_4_ = local_12c0._28_4_;
                local_1260._4_4_ = fVar157 * fVar11;
                local_1260._0_4_ = fVar156 * fVar1;
                local_1260._8_4_ = fVar158 * fVar12;
                local_1260._12_4_ = fVar159 * fVar13;
                local_1260._16_4_ = fVar160 * fVar14;
                local_1260._20_4_ = fVar161 * fVar15;
                local_1260._24_4_ = fVar91 * fVar16;
                local_1260._28_4_ = local_12e0._28_4_;
                local_1240[0] = fVar1 * fVar115;
                local_1240[1] = fVar11 * fVar116;
                local_1240[2] = fVar12 * fVar117;
                local_1240[3] = fVar13 * fVar118;
                fStack_1230 = fVar14 * fVar119;
                fStack_122c = fVar15 * fVar120;
                fStack_1228 = fVar16 * fVar121;
                uStack_1224 = local_1320._28_4_;
                auVar82 = vpsllw_avx(auVar82,0xf);
                auVar82 = vpacksswb_avx(auVar82,auVar82);
                uVar73 = (ulong)(byte)(SUB161(auVar82 >> 7,0) & 1 |
                                       (SUB161(auVar82 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar82 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar82 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar82 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar82 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar82 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar82 >> 0x3f,0) << 7);
                auVar155 = ZEXT3264(local_15c0);
                auVar162 = ZEXT3264(local_15e0);
                auVar164 = ZEXT3264(local_1600);
                auVar166 = ZEXT3264(local_1620);
                auVar169 = ZEXT3264(local_1640);
                auVar185 = ZEXT3264(local_1660);
                auVar199 = ZEXT3264(local_1680);
                auVar201 = ZEXT3264(local_16a0);
                auVar128 = ZEXT3264(local_16c0);
                auVar144 = ZEXT3264(local_16e0);
                auVar205 = ZEXT3264(local_1700);
                do {
                  uVar79 = 0;
                  if (uVar73 != 0) {
                    for (; (uVar73 >> uVar79 & 1) == 0; uVar79 = uVar79 + 1) {
                    }
                  }
                  local_17a8 = *(uint *)((long)&local_13e0 + uVar79 * 4);
                  pGVar9 = (pSVar3->geometries).items[local_17a8].ptr;
                  if ((pGVar9->mask & ray->mask) == 0) {
                    uVar73 = uVar73 ^ 1L << (uVar79 & 0x3f);
                    bVar68 = true;
                  }
                  else {
                    pRVar10 = context->args;
                    if ((pRVar10->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar68 = false;
                    }
                    else {
                      local_17b4 = *(undefined4 *)(local_12e0 + uVar79 * 4);
                      local_17b0 = *(undefined4 *)(local_12c0 + uVar79 * 4);
                      local_1790.context = context->user;
                      local_17ac = *(undefined4 *)((long)&local_1400 + uVar79 * 4);
                      local_17c0 = *(undefined4 *)(local_1280 + uVar79 * 4);
                      local_17bc = local_1240[uVar79 - 8];
                      local_17b8 = local_1240[uVar79];
                      local_17a4 = (local_1790.context)->instID[0];
                      local_17a0 = (local_1790.context)->instPrimID[0];
                      local_1720 = ray->tfar;
                      ray->tfar = *(float *)(local_12a0 + uVar79 * 4);
                      local_17fc = -1;
                      local_1790.valid = &local_17fc;
                      local_1790.geometryUserPtr = pGVar9->userPtr;
                      local_1790.hit = (RTCHitN *)&local_17c0;
                      local_1790.N = 1;
                      local_1790.ray = (RTCRayN *)ray;
                      if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0030d123:
                        if (pRVar10->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar10->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar10->filter)(&local_1790);
                            auVar205 = ZEXT3264(local_1700);
                            auVar144 = ZEXT3264(local_16e0);
                            auVar128 = ZEXT3264(local_16c0);
                            auVar201 = ZEXT3264(local_16a0);
                            auVar199 = ZEXT3264(local_1680);
                            auVar185 = ZEXT3264(local_1660);
                            auVar169 = ZEXT3264(local_1640);
                            auVar166 = ZEXT3264(local_1620);
                            auVar164 = ZEXT3264(local_1600);
                            auVar162 = ZEXT3264(local_15e0);
                            auVar155 = ZEXT3264(local_15c0);
                          }
                          if (*local_1790.valid == 0) goto LAB_0030d1e2;
                        }
                        bVar68 = false;
                      }
                      else {
                        local_1740 = context;
                        local_1760 = ray;
                        (*pGVar9->occlusionFilterN)(&local_1790);
                        auVar205 = ZEXT3264(local_1700);
                        auVar144 = ZEXT3264(local_16e0);
                        auVar128 = ZEXT3264(local_16c0);
                        auVar201 = ZEXT3264(local_16a0);
                        auVar199 = ZEXT3264(local_1680);
                        auVar185 = ZEXT3264(local_1660);
                        auVar169 = ZEXT3264(local_1640);
                        auVar166 = ZEXT3264(local_1620);
                        auVar164 = ZEXT3264(local_1600);
                        auVar162 = ZEXT3264(local_15e0);
                        auVar155 = ZEXT3264(local_15c0);
                        context = local_1740;
                        ray = local_1760;
                        if (*local_1790.valid != 0) goto LAB_0030d123;
LAB_0030d1e2:
                        ray->tfar = local_1720;
                        uVar73 = uVar73 ^ 1L << (uVar79 & 0x3f);
                        bVar68 = true;
                      }
                    }
                  }
                  iVar78 = 0;
                  uVar79 = local_17e0;
                  uVar80 = local_17e8;
                  if (!bVar68) {
                    if (bVar81) {
                      ray->tfar = -INFINITY;
                      iVar78 = 3;
                    }
                    goto LAB_0030d2c7;
                  }
                } while (uVar73 != 0);
              }
              iVar78 = 0;
              local_17d0 = local_17d0 + 1;
              bVar81 = local_17d0 < local_17d8;
            } while (local_17d0 != local_17d8);
          }
        }
LAB_0030d2c7:
      } while (iVar78 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }